

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O1

CTransactionRef __thiscall
TxPackageTest::create_placeholder_tx(TxPackageTest *this,size_t num_inputs,size_t num_outputs)

{
  uchar *puVar1;
  TestingSetup *pTVar2;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  size_type in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar3;
  FastRandomContext *this_01;
  long in_FS_OFFSET;
  Span<std::byte> output;
  span<const_std::byte,_18446744073709551615UL> b;
  Span<std::byte> output_00;
  span<const_std::byte,_18446744073709551615UL> b_00;
  Span<std::byte> output_01;
  CTransactionRef CVar4;
  CMutableTransaction mtx;
  uint256 ret_1;
  uint256 ret;
  uint256 ret_2;
  CScript random_script;
  pointer local_128;
  long local_120;
  long local_118;
  pointer local_110;
  long local_108;
  long local_100;
  CMutableTransaction local_f8;
  allocator_type local_b9;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  byte local_98 [32];
  undefined1 local_78 [28];
  uint uStack_5c;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_f8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&local_f8.vin,num_outputs);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_f8.vout,in_RCX);
  local_78._16_8_ = 0;
  stack0xffffffffffffffa0 = 0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = 0;
  this_01 = (FastRandomContext *)(num_inputs + 0x110);
  local_98[0x10] = 0;
  local_98[0x11] = 0;
  local_98[0x12] = 0;
  local_98[0x13] = 0;
  local_98[0x14] = 0;
  local_98[0x15] = 0;
  local_98[0x16] = 0;
  local_98[0x17] = 0;
  local_98[0x18] = 0;
  local_98[0x19] = 0;
  local_98[0x1a] = 0;
  local_98[0x1b] = 0;
  local_98[0x1c] = 0;
  local_98[0x1d] = 0;
  local_98[0x1e] = 0;
  local_98[0x1f] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[6] = 0;
  local_98[7] = 0;
  local_98[8] = 0;
  local_98[9] = 0;
  local_98[10] = 0;
  local_98[0xb] = 0;
  local_98[0xc] = 0;
  local_98[0xd] = 0;
  local_98[0xe] = 0;
  local_98[0xf] = 0;
  output.m_size = 0x20;
  output.m_data = local_98;
  FastRandomContext::fillrand(this_01,output);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_110,local_98,local_78,
             (allocator_type *)&local_b8);
  b._M_extent._M_extent_value = local_108 - (long)local_110;
  b._M_ptr = local_110;
  this_00 = CScript::operator<<((CScript *)local_78,b);
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  output_00.m_size = 0x20;
  output_00.m_data = (byte *)&local_b8;
  FastRandomContext::fillrand(this_01,output_00);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_128,(uchar *)&local_b8,
             local_98,&local_b9);
  b_00._M_extent._M_extent_value = local_120 - (long)local_128;
  b_00._M_ptr = local_128;
  other = &CScript::operator<<(this_00,b_00)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,other);
  if (local_128 != (pointer)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  if (local_110 != (pointer)0x0) {
    operator_delete(local_110,local_100 - (long)local_110);
  }
  if (0x1c < uStack_5c) {
    free((void *)local_78._0_8_);
    local_78._0_8_ = (char *)0x0;
  }
  if (num_outputs != 0) {
    lVar3 = 0x28;
    do {
      local_78._16_8_ = 0;
      stack0xffffffffffffffa0 = 0;
      local_78._0_8_ = (char *)0x0;
      local_78._8_8_ = 0;
      output_01.m_size = 0x20;
      output_01.m_data = local_78;
      FastRandomContext::fillrand(this_01,output_01);
      puVar1 = ((local_f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar3 + -0x18;
      *(undefined8 *)puVar1 = local_78._16_8_;
      *(undefined8 *)(puVar1 + 8) = stack0xffffffffffffffa0;
      puVar1 = ((local_f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar3 + -0x28;
      *(undefined8 *)puVar1 = local_78._0_8_;
      *(undefined8 *)(puVar1 + 8) = local_78._8_8_;
      puVar1 = ((local_f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar3 + -8;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 (((local_f8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>
                  .m_data._M_elems + lVar3),
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents);
      lVar3 = lVar3 + 0x68;
      num_outputs = num_outputs - 1;
    } while (num_outputs != 0);
  }
  if (in_RCX != 0) {
    lVar3 = 8;
    do {
      *(undefined8 *)
       ((long)local_f8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start + lVar3 + -8) = 1000000;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 ((long)&(local_f8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue + lVar3),
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents);
      lVar3 = lVar3 + 0x28;
      in_RCX = in_RCX - 1;
    } while (in_RCX != 0);
  }
  pTVar2 = &(this->super_TestChain100Setup).super_TestingSetup;
  (pTVar2->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.m_flag =
       (__atomic_base<bool>)0x0;
  *(undefined3 *)&(pTVar2->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.field_0x1 =
       0;
  (pTVar2->super_ChainTestingSetup).super_BasicTestingSetup.m_interrupt.m_pipe_r = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
              super_BasicTestingSetup.m_interrupt.m_pipe_w,(CTransaction **)this,
             (allocator<CTransaction> *)local_78,&local_f8);
  if (0x1c < local_3c) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_f8.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_f8.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (CTransactionRef)CVar4.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __stack_chk_fail();
}

Assistant:

inline CTransactionRef create_placeholder_tx(size_t num_inputs, size_t num_outputs)
{
    CMutableTransaction mtx = CMutableTransaction();
    mtx.vin.resize(num_inputs);
    mtx.vout.resize(num_outputs);
    auto random_script = CScript() << ToByteVector(m_rng.rand256()) << ToByteVector(m_rng.rand256());
    for (size_t i{0}; i < num_inputs; ++i) {
        mtx.vin[i].prevout.hash = Txid::FromUint256(m_rng.rand256());
        mtx.vin[i].prevout.n = 0;
        mtx.vin[i].scriptSig = random_script;
    }
    for (size_t o{0}; o < num_outputs; ++o) {
        mtx.vout[o].nValue = 1 * CENT;
        mtx.vout[o].scriptPubKey = random_script;
    }
    return MakeTransactionRef(mtx);
}